

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int amqpvalue_get_detach(AMQP_VALUE value,DETACH_HANDLE *detach_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  DETACH_HANDLE pDVar4;
  AMQP_VALUE pAVar5;
  AMQP_VALUE pAVar6;
  uint32_t list_item_count;
  handle handle;
  uint local_34;
  ERROR_HANDLE local_30;
  
  pDVar4 = (DETACH_HANDLE)malloc(8);
  if (pDVar4 == (DETACH_HANDLE)0x0) {
    *detach_handle = (DETACH_HANDLE)0x0;
    iVar3 = 0x23f6;
  }
  else {
    pDVar4->composite_value = (AMQP_VALUE)0x0;
    *detach_handle = pDVar4;
    pAVar5 = amqpvalue_get_inplace_described_value(value);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      detach_destroy(*detach_handle);
      iVar3 = 0x23fe;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar5,&local_34);
      iVar3 = 0x2405;
      if (iVar1 == 0) {
        if (local_34 == 0) {
          iVar3 = 0x2432;
        }
        else {
          pAVar6 = amqpvalue_get_list_item(pAVar5,0);
          if (pAVar6 == (AMQP_VALUE)0x0) {
            detach_destroy(*detach_handle);
            iVar3 = 0x2414;
          }
          else {
            AVar2 = amqpvalue_get_type(pAVar6);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAVar6);
              detach_destroy(*detach_handle);
              iVar3 = 0x241e;
            }
            else {
              iVar3 = amqpvalue_get_uint(pAVar6,(uint32_t *)&local_30);
              if (iVar3 == 0) {
                amqpvalue_destroy(pAVar6);
                if (1 < local_34) {
                  pAVar6 = amqpvalue_get_list_item(pAVar5,1);
                  if (pAVar6 != (AMQP_VALUE)0x0) {
                    AVar2 = amqpvalue_get_type(pAVar6);
                    if ((AVar2 != AMQP_TYPE_NULL) &&
                       (iVar3 = amqpvalue_get_boolean(pAVar6,(_Bool *)&local_30), iVar3 != 0)) {
                      amqpvalue_destroy(pAVar6);
                      detach_destroy(*detach_handle);
                      return 0x244a;
                    }
                    amqpvalue_destroy(pAVar6);
                  }
                  if ((2 < local_34) &&
                     (pAVar5 = amqpvalue_get_list_item(pAVar5,2), pAVar5 != (AMQP_VALUE)0x0)) {
                    AVar2 = amqpvalue_get_type(pAVar5);
                    if (AVar2 != AMQP_TYPE_NULL) {
                      iVar3 = amqpvalue_get_error(pAVar5,&local_30);
                      if (iVar3 != 0) {
                        amqpvalue_destroy(pAVar5);
                        detach_destroy(*detach_handle);
                        return 0x2467;
                      }
                      error_destroy(local_30);
                    }
                    amqpvalue_destroy(pAVar5);
                  }
                }
                pAVar5 = amqpvalue_clone(value);
                pDVar4->composite_value = pAVar5;
                iVar3 = 0;
              }
              else {
                amqpvalue_destroy(pAVar6);
                detach_destroy(*detach_handle);
                iVar3 = 0x2428;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_detach(AMQP_VALUE value, DETACH_HANDLE* detach_handle)
{
    int result;
    DETACH_INSTANCE* detach_instance = (DETACH_INSTANCE*)detach_create_internal();
    *detach_handle = detach_instance;
    if (*detach_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            detach_destroy(*detach_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* handle */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                detach_destroy(*detach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                detach_destroy(*detach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                handle handle;
                                if (amqpvalue_get_handle(item_value, &handle) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    detach_destroy(*detach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* closed */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool closed;
                                if (amqpvalue_get_boolean(item_value, &closed) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    detach_destroy(*detach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* error */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                ERROR_HANDLE error;
                                if (amqpvalue_get_error(item_value, &error) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    detach_destroy(*detach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                                else
                                {
                                    error_destroy(error);
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    detach_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}